

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

QPDFAcroFormDocumentHelper *
get_afdh_for_qpdf(map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
                  *afdh_map,QPDF *q)

{
  size_type sVar1;
  __shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> *this;
  mapped_type *pmVar2;
  unsigned_long_long uid;
  unsigned_long_long local_28;
  __shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  local_28 = QPDF::getUniqueId(q);
  sVar1 = std::
          map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
          ::count(afdh_map,&local_28);
  if (sVar1 == 0) {
    std::make_shared<QPDFAcroFormDocumentHelper,QPDF&>((QPDF *)&local_20);
    this = &std::
            map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
            ::operator[](afdh_map,&local_28)->
            super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  }
  pmVar2 = std::
           map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
           ::operator[](afdh_map,&local_28);
  return (pmVar2->super___shared_ptr<QPDFAcroFormDocumentHelper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
}

Assistant:

static QPDFAcroFormDocumentHelper*
get_afdh_for_qpdf(
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>>& afdh_map, QPDF* q)
{
    auto uid = q->getUniqueId();
    if (!afdh_map.count(uid)) {
        afdh_map[uid] = std::make_shared<QPDFAcroFormDocumentHelper>(*q);
    }
    return afdh_map[uid].get();
}